

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int custom_2(int pi,uint arg1,char *argx,uint count,char *retBuf,uint32_t retMax)

{
  undefined8 in_RDX;
  gpioExtent_t *in_R8;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fb0;
  int in_stack_00000fb4;
  void *in_stack_00000fb8;
  int in_stack_00000fc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 local_28;
  int in_stack_ffffffffffffffe8;
  
  local_28 = pigpio_command_ext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                in_stack_ffffffffffffffc8,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,0
                                ,in_R8,in_stack_ffffffffffffffe8);
  if (0 < local_28) {
    local_28 = recvMax(in_stack_00000fc4,in_stack_00000fb8,in_stack_00000fb4,in_stack_00000fb0);
  }
  _pmu(0);
  return local_28;
}

Assistant:

int custom_2(int pi, unsigned arg1, char *argx, unsigned count,
             char *retBuf, uint32_t retMax)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=arg1
   p2=retMax
   p3=count
   ## extension ##
   char argx[count]
   */

   ext[0].size = count;
   ext[0].ptr = argx;

   bytes = pigpio_command_ext
      (pi, PI_CMD_CF2, arg1, retMax, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, retBuf, retMax, bytes);
   }

   _pmu(pi);

   return bytes;
}